

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

void common_timeout_callback(int fd,short what,void *arg)

{
  event_base *base_00;
  event *ev_00;
  event *ev;
  event_base *base;
  common_timeout_list *ctl;
  timeval now;
  void *arg_local;
  short what_local;
  int fd_local;
  
  base_00 = *(event_base **)((long)arg + 0xa0);
  now.tv_usec = (__suseconds_t)arg;
  if (base_00->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.lock)(0,base_00->th_base_lock);
  }
  gettime(base_00,(timeval *)&ctl);
  while (((ev_00 = *arg, ev_00 != (event *)0x0 && ((ev_00->ev_timeout).tv_sec <= (long)ctl)) &&
         (((common_timeout_list *)(ev_00->ev_timeout).tv_sec != ctl ||
          ((long)((ev_00->ev_timeout).tv_usec & 0xfffffU) <= now.tv_sec))))) {
    event_del_nolock_(ev_00,0);
    event_active_nolock_(ev_00,1,1);
  }
  if (ev_00 != (event *)0x0) {
    common_timeout_schedule((common_timeout_list *)arg,(timeval *)&ctl,ev_00);
  }
  if (base_00->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.unlock)(0,base_00->th_base_lock);
  }
  return;
}

Assistant:

static void
common_timeout_callback(evutil_socket_t fd, short what, void *arg)
{
	struct timeval now;
	struct common_timeout_list *ctl = arg;
	struct event_base *base = ctl->base;
	struct event *ev = NULL;
	EVBASE_ACQUIRE_LOCK(base, th_base_lock);
	gettime(base, &now);
	while (1) {
		ev = TAILQ_FIRST(&ctl->events);
		if (!ev || ev->ev_timeout.tv_sec > now.tv_sec ||
		    (ev->ev_timeout.tv_sec == now.tv_sec &&
			(ev->ev_timeout.tv_usec&MICROSECONDS_MASK) > now.tv_usec))
			break;
		event_del_nolock_(ev, EVENT_DEL_NOBLOCK);
		event_active_nolock_(ev, EV_TIMEOUT, 1);
	}
	if (ev)
		common_timeout_schedule(ctl, &now, ev);
	EVBASE_RELEASE_LOCK(base, th_base_lock);
}